

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_oper.cpp
# Opt level: O1

void __thiscall FParser::OPcmp(FParser *this,svalue_t *result,int start,int n,int stop)

{
  int iVar1;
  fsfix fVar2;
  bool bVar3;
  svalue_t right;
  svalue_t left;
  svalue_t local_60;
  svalue_t local_48;
  
  local_48.string.Chars = FString::NullString.Nothing;
  local_48.type = 1;
  local_48.value.i = 0;
  local_60.string.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  local_60.type = 1;
  local_60.value.i = 0;
  EvaluateExpression(this,&local_48,start,n + -1);
  EvaluateExpression(this,&local_60,n + 1,stop);
  result->type = 1;
  if (local_48.type == 0 && local_60.type == 0) {
    iVar1 = strcmp(local_48.string.Chars,local_60.string.Chars);
    bVar3 = iVar1 == 0;
  }
  else if (local_60.type == 2 && local_48.type == 2) {
    bVar3 = CONCAT44(local_48.value._4_4_,local_48.value.i) ==
            CONCAT44(local_60.value._4_4_,local_60.value.i);
  }
  else {
    if (local_60.type == 6 || local_48.type == 6) {
      fVar2 = fixedvalue(&local_48);
      iVar1 = fixedvalue(&local_60);
    }
    else {
      fVar2 = intvalue(&local_48);
      iVar1 = intvalue(&local_60);
    }
    bVar3 = fVar2 == iVar1;
  }
  *(uint *)&result->value = (uint)bVar3;
  FString::~FString(&local_60.string);
  FString::~FString(&local_48.string);
  return;
}

Assistant:

void FParser::OPcmp(svalue_t &result, int start, int n, int stop)
{
	svalue_t left, right;
	
	evaluate_leftnright(start, n, stop);
	
	result.type = svt_int;        // always an int returned
	
	if(left.type == svt_string && right.type == svt_string)
	{
		result.value.i = !strcmp(left.string, right.string);
		return;
	}
	
	// haleyjd: direct mobj comparison when both are mobj
	if(left.type == svt_mobj && right.type == svt_mobj)
	{
		// we can safely assume reference equivalency for
		// AActor's in all cases since they are static for the
		// duration of a level
		result.value.i = (left.value.mobj == right.value.mobj);
		return;
	}
	
	if(left.type == svt_fixed || right.type == svt_fixed)
	{
		result.value.i = (fixedvalue(left) == fixedvalue(right));
		return;
	}
	
	result.value.i = (intvalue(left) == intvalue(right));
}